

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void fs_register_field(void *serializer,char *name,int name_length,char *data_type,
                      int data_type_length,int bytes_per_element,int isize,int jsize,int ksize,
                      int lsize,int iminushalo,int iplushalo,int jminushalo,int jplushalo,
                      int kminushalo,int kplushalo,int lminushalo,int lplushalo)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_b1;
  string local_b0;
  allocator local_79;
  string local_78;
  int local_58;
  int local_54;
  int bytes_per_element_local;
  int data_type_length_local;
  char *data_type_local;
  char *pcStack_40;
  int name_length_local;
  char *name_local;
  void *serializer_local;
  
  local_58 = bytes_per_element;
  local_54 = data_type_length;
  _bytes_per_element_local = data_type;
  data_type_local._4_4_ = name_length;
  pcStack_40 = name;
  name_local = (char *)serializer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,name,(long)name_length,&local_79);
  pcVar1 = _bytes_per_element_local;
  uVar2 = (ulong)local_54;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,pcVar1,uVar2,&local_b1);
  ser::Serializer::RegisterField
            ((Serializer *)serializer,&local_78,&local_b0,local_58,isize,jsize,ksize,lsize,
             iminushalo,iplushalo,jminushalo,jplushalo,kminushalo,kplushalo,lminushalo,lplushalo);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

void fs_register_field(void* serializer, const char* name, int name_length,
                       const char* data_type, int data_type_length, int bytes_per_element,
                       int isize, int jsize, int ksize, int lsize,
                       int iminushalo, int iplushalo, int jminushalo, int jplushalo,
                       int kminushalo, int kplushalo, int lminushalo, int lplushalo)
{
    reinterpret_cast<Serializer*>(serializer)->RegisterField(
                         std::string(name, name_length), std::string(data_type, data_type_length),
                         bytes_per_element, isize, jsize, ksize, lsize,
                         iminushalo, iplushalo, jminushalo, jplushalo,
                         kminushalo, kplushalo, lminushalo, lplushalo);
}